

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::disallow_forwarding_in_expression_chain
          (CompilerGLSL *this,SPIRExpression *expr)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  size_type sVar4;
  SPIRExpression *expr_00;
  long lVar5;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t local_24;
  
  bVar3 = expression_is_forwarded(this,(expr->super_IVariant).self.id);
  if (bVar3) {
    bVar3 = expression_suppresses_usage_tracking(this,(expr->super_IVariant).self.id);
    if (!bVar3) {
      this_00 = &(this->super_Compiler).forced_invariant_temporaries;
      local_24 = (expr->super_IVariant).self.id;
      sVar4 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&this_00->_M_h,&local_24);
      if (sVar4 == 0) {
        local_28 = (expr->super_IVariant).self.id;
        ::std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)&(this->super_Compiler).forced_temporaries,&local_28);
        local_2c = (expr->super_IVariant).self.id;
        ::std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)this_00,&local_2c);
        Compiler::force_recompile(&this->super_Compiler);
        pTVar1 = (expr->expression_dependencies).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        sVar2 = (expr->expression_dependencies).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
        for (lVar5 = 0; sVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
          expr_00 = Compiler::get<spirv_cross::SPIRExpression>
                              (&this->super_Compiler,*(uint32_t *)((long)&pTVar1->id + lVar5));
          disallow_forwarding_in_expression_chain(this,expr_00);
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::disallow_forwarding_in_expression_chain(const SPIRExpression &expr)
{
	// Allow trivially forwarded expressions like OpLoad or trivial shuffles,
	// these will be marked as having suppressed usage tracking.
	// Our only concern is to make sure arithmetic operations are done in similar ways.
	if (expression_is_forwarded(expr.self) && !expression_suppresses_usage_tracking(expr.self) &&
	    forced_invariant_temporaries.count(expr.self) == 0)
	{
		forced_temporaries.insert(expr.self);
		forced_invariant_temporaries.insert(expr.self);
		force_recompile();

		for (auto &dependent : expr.expression_dependencies)
			disallow_forwarding_in_expression_chain(get<SPIRExpression>(dependent));
	}
}